

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCompressedTexture.cpp
# Opt level: O3

void tcu::anon_unknown_0::EtcDecompressInternal::decompressETC2Block
               (deUint8 *dst,deUint64 src,deUint8 *alphaDst,bool alphaMode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  deUint8 dVar4;
  undefined1 uVar5;
  int x;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  undefined1 uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  undefined7 in_register_00000009;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  byte bVar17;
  deUint8 dVar18;
  int iVar19;
  int iVar20;
  byte bVar21;
  uint uVar22;
  deUint8 *pdVar23;
  byte bVar24;
  int pixelNdx_1;
  uint uVar25;
  int iVar26;
  int iVar27;
  byte bVar28;
  int pixelNdx;
  uint uVar29;
  ulong uVar30;
  undefined1 uVar31;
  uint uVar32;
  int iVar33;
  char cVar34;
  byte bVar35;
  uint uVar36;
  long lVar37;
  uint uVar38;
  uint uVar39;
  int iVar40;
  deUint8 *pdVar41;
  bool bVar42;
  bool bVar43;
  byte local_6c [4];
  byte local_68 [4];
  undefined4 local_64;
  uint local_60;
  undefined4 local_5c;
  byte local_56 [6];
  deUint8 *local_50;
  deUint32 table [2];
  
  local_50 = alphaDst;
  bVar24 = (byte)(src >> 0x38);
  uVar36 = bVar24 & 7;
  local_5c = (int)CONCAT71(in_register_00000009,alphaMode);
  bVar35 = (byte)(src >> 0x30);
  bVar28 = (byte)(src >> 0x28);
  uVar10 = (uint)(src >> 0x20);
  if ((src >> 0x21 & 1) != 0 || alphaMode) {
    cVar34 = ((uVar36 < 4) << 3 | (byte)uVar36) - 8;
    if ((int)cVar34 + (uVar10 >> 0x1b) < 0x20) {
      uVar38 = uVar10 >> 0x13 & 0x1f;
      bVar21 = (char)(bVar35 << 5) >> 7 & 0xf8U | bVar35 & 7;
      if ((int)(char)bVar21 + uVar38 < 0x20) {
        uVar36 = uVar10 >> 0xb & 0x1f;
        bVar28 = (char)(bVar28 << 5) >> 7 & 0xf8U | bVar28 & 7;
        if (0x1f < (int)(char)bVar28 + uVar36) {
          bVar17 = (bVar24 >> 1 & 0x30) >> 4 | (bVar24 >> 1) << 2;
          bVar28 = (byte)(src >> 0x21);
          bVar21 = (byte)(src >> 0x19) & 0x7f;
          bVar1 = (byte)(src >> 0x13);
          bVar2 = (byte)(src >> 0xd);
          bVar3 = (byte)(src >> 6);
          bVar35 = ((byte)(src >> 0x2b) & 3) << 3 | (bVar35 & 1) << 5;
          bVar35 = ((byte)(src >> 0x27) & 7 | bVar35) << 2 | bVar35 >> 4;
          iVar11 = (uint)bVar35 * 4 + 2;
          bVar24 = bVar24 << 7 | ((byte)(src >> 0x31) & 0x3f) * '\x02' | bVar24 & 1;
          iVar26 = (uint)bVar24 * 4 + 2;
          iVar15 = (uint)bVar17 * 4 + 2;
          pdVar41 = dst + 2;
          lVar37 = 0;
          do {
            lVar8 = 0;
            pdVar23 = pdVar41;
            iVar20 = iVar26;
            iVar33 = iVar15;
            iVar40 = iVar11;
            do {
              iVar19 = iVar33 >> 2;
              iVar27 = iVar20 >> 2;
              iVar13 = iVar40 >> 2;
              if (0xfe < iVar19) {
                iVar19 = 0xff;
              }
              dVar18 = '\0';
              dVar4 = (deUint8)iVar19;
              if (iVar19 < 1) {
                dVar4 = dVar18;
              }
              pdVar23[-2] = dVar4;
              if (0xfe < iVar27) {
                iVar27 = 0xff;
              }
              dVar4 = (deUint8)iVar27;
              if (iVar27 < 1) {
                dVar4 = dVar18;
              }
              pdVar23[-1] = dVar4;
              if (0xfe < iVar13) {
                iVar13 = 0xff;
              }
              dVar4 = (deUint8)iVar13;
              if (iVar13 < 1) {
                dVar4 = dVar18;
              }
              *pdVar23 = dVar4;
              if (alphaMode) {
                local_50[lVar8] = 0xff;
              }
              lVar8 = lVar8 + 1;
              iVar40 = iVar40 + ((uint)(byte)((bVar1 & 0x30) >> 4 | bVar1 << 2) - (uint)bVar35);
              iVar20 = iVar20 + ((uint)(byte)(bVar21 >> 6 | bVar21 * '\x02') - (uint)bVar24);
              iVar33 = iVar33 + ((uint)(byte)(((byte)(src >> 0x20) & 1) << 2 |
                                             (bVar28 & 0x3e) * '\x04' + ((bVar28 & 0x30) >> 4)) -
                                (uint)bVar17);
              pdVar23 = pdVar23 + 3;
            } while (lVar8 != 4);
            lVar37 = lVar37 + 1;
            iVar11 = iVar11 + ((uint)(byte)(((byte)src & 0x30) >> 4 | (byte)src << 2) - (uint)bVar35
                              );
            iVar26 = iVar26 + ((uint)(byte)((bVar3 & 0x40) >> 6 | bVar3 * '\x02') - (uint)bVar24);
            iVar15 = iVar15 + ((uint)(byte)((bVar2 & 0x30) >> 4 | bVar2 << 2) - (uint)bVar17);
            pdVar41 = pdVar41 + 0xc;
            local_50 = local_50 + 4;
          } while (lVar37 != 4);
          return;
        }
        local_64 = uVar10 >> 5 & 7;
        local_60 = uVar10 >> 2 & 7;
        bVar35 = cVar34 + (bVar24 >> 3);
        local_68[0] = bVar24 >> 5 | bVar24 & 0xf8;
        bVar24 = (byte)uVar38;
        bVar21 = bVar21 + bVar24;
        local_6c[0] = bVar24 >> 2 | bVar24 * '\b';
        bVar24 = (byte)uVar36;
        bVar28 = bVar28 + bVar24;
        local_56[0] = bVar24 >> 2 | bVar24 * '\b';
        local_68[1] = bVar35 >> 2 | bVar35 * '\b';
        local_6c[1] = bVar21 >> 2 | bVar21 * '\b';
        local_56[1] = bVar28 >> 2 | bVar28 * '\b';
        goto LAB_00a7a1c9;
      }
      uVar12 = uVar10 >> 0x1b & 0xf;
      uVar16 = uVar10 >> 0xb & 0xf;
      uVar6 = uVar10 >> 7 & 0xf;
      uVar29 = uVar10 >> 3 & 0xf;
      uVar22 = uVar12 << 4 | uVar12;
      uVar36 = (uVar10 >> 0x14 & 1) + uVar36 * 2;
      uVar39 = uVar36 * 0x10 | uVar36;
      uVar38 = (uVar10 >> 0xf & 7) + (uVar10 >> 0x13 & 1) * 8;
      uVar38 = uVar38 * 0x10 | uVar38;
      uVar32 = uVar16 << 4 | uVar16;
      uVar25 = uVar6 << 4 | uVar6;
      uVar29 = uVar29 << 4 | uVar29;
      iVar15 = decompressETC2Block::distTable
               [(uint)((uVar6 * 0x1100 | uVar16 * 0x110000 | uVar29) <=
                      (uVar36 * 0x1100 | uVar12 * 0x110000 | uVar38)) |
                (uint)(src >> 0x1f) & 2 | uVar10 & 4];
      iVar11 = iVar15 + uVar22;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      bVar28 = 0;
      bVar24 = (byte)iVar11;
      if (iVar11 < 1) {
        bVar24 = bVar28;
      }
      iVar11 = iVar15 + uVar39;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      local_68[0] = (byte)iVar11;
      if (iVar11 < 1) {
        local_68[0] = bVar28;
      }
      iVar11 = iVar15 + uVar38;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      local_6c[0] = (byte)iVar11;
      if (iVar11 < 1) {
        local_6c[0] = bVar28;
      }
      iVar11 = uVar22 - iVar15;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      bVar35 = (byte)iVar11;
      if (iVar11 < 1) {
        bVar35 = bVar28;
      }
      local_64._0_2_ = CONCAT11(bVar35,bVar24);
      iVar11 = uVar39 - iVar15;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      uVar9 = 0;
      local_68[1] = (char)iVar11;
      if (iVar11 < 1) {
        local_68[1] = uVar9;
      }
      iVar11 = uVar38 - iVar15;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      local_6c[1] = (char)iVar11;
      if (iVar11 < 1) {
        local_6c[1] = uVar9;
      }
      iVar11 = iVar15 + uVar32;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      uVar5 = (char)iVar11;
      if (iVar11 < 1) {
        uVar5 = uVar9;
      }
      iVar11 = iVar15 + uVar25;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      local_68[2] = (char)iVar11;
      if (iVar11 < 1) {
        local_68[2] = 0;
      }
      iVar11 = iVar15 + uVar29;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      local_6c[2] = (char)iVar11;
      if (iVar11 < 1) {
        local_6c[2] = 0;
      }
      iVar11 = uVar32 - iVar15;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      uVar31 = (char)iVar11;
      if (iVar11 < 1) {
        uVar31 = uVar9;
      }
      local_64 = CONCAT13(uVar31,CONCAT12(uVar5,(undefined2)local_64));
      iVar11 = uVar25 - iVar15;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      local_68[3] = (byte)iVar11;
      uVar29 = uVar29 - iVar15;
    }
    else {
      iVar15 = decompressETC2Block::distTable[uVar10 & 1 | uVar10 >> 1 & 6];
      bVar24 = (bVar24 & 3) + (bVar24 >> 3 & 3) * '\x04';
      local_68[0] = ((byte)(src >> 0x34) & 0xf) * '\x11';
      local_6c[0] = (bVar35 & 0xf) * '\x11';
      bVar35 = ((byte)(src >> 0x2c) & 0xf) * '\x11';
      local_68[2] = (bVar28 & 0xf) * '\x11';
      local_6c[2] = ((byte)(src >> 0x24) & 0xf) * '\x11';
      iVar11 = iVar15 + (uint)bVar35;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      local_64._0_2_ = CONCAT11((char)iVar11,bVar24 * '\x10' | bVar24);
      iVar11 = iVar15 + (uint)local_68[2];
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      local_68[1] = (byte)iVar11;
      if (iVar11 < 1) {
        local_68[1] = 0;
      }
      iVar11 = iVar15 + (uint)local_6c[2];
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      local_6c[1] = (byte)iVar11;
      if (iVar11 < 1) {
        local_6c[1] = 0;
      }
      iVar11 = (uint)bVar35 - iVar15;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      uVar9 = (undefined1)iVar11;
      if (iVar11 < 1) {
        uVar9 = 0;
      }
      local_64 = CONCAT13(uVar9,CONCAT12(bVar35,(undefined2)local_64));
      iVar11 = (uint)local_68[2] - iVar15;
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      local_68[3] = (byte)iVar11;
      uVar29 = (uint)local_6c[2] - iVar15;
    }
    uVar10 = 0xff;
    if ((int)uVar29 < 0xff) {
      uVar10 = uVar29;
    }
    uVar36 = 0;
    if ((int)uVar10 < 1) {
      uVar10 = uVar36;
    }
    local_6c[3] = (char)uVar10;
    uVar30 = 0;
    do {
      uVar7 = (ulong)(uVar36 & 0xc | (uint)(uVar30 >> 2) & 0x3fffffff);
      lVar37 = uVar7 * 3;
      uVar10 = (uint)((src >> (uVar30 & 0x3f) & 1) != 0) +
               ((uint)(src >> ((char)uVar30 + 0x10U & 0x3f)) & 1) * 2;
      if (uVar10 == 2 && ((src >> 0x21 & 1) == 0 && alphaMode)) {
        (dst + lVar37)[0] = '\0';
        (dst + lVar37)[1] = '\0';
        dst[lVar37 + 2] = '\0';
        dVar4 = '\0';
LAB_00a7a767:
        alphaDst[uVar7] = dVar4;
      }
      else {
        uVar14 = (ulong)uVar10;
        dst[lVar37] = *(deUint8 *)((long)&local_64 + uVar14);
        dst[lVar37 + 1] = local_68[uVar14];
        dst[lVar37 + 2] = local_6c[uVar14];
        dVar4 = 0xff;
        if (alphaMode) goto LAB_00a7a767;
      }
      uVar30 = uVar30 + 1;
      uVar36 = uVar36 + 4;
    } while (uVar30 != 0x10);
  }
  else {
    local_64 = uVar10 >> 5 & 7;
    local_60 = uVar10 >> 2 & 7;
    local_68[0] = (byte)((uVar10 >> 0x1c) << 4) | bVar24 >> 4;
    local_68[1] = (bVar24 & 0xf) * '\x11';
    local_6c[0] = ((byte)(src >> 0x34) & 0xf) * '\x11';
    local_6c[1] = (bVar35 & 0xf) * '\x11';
    local_56[0] = ((byte)(src >> 0x2c) & 0xf) * '\x11';
    local_56[1] = (bVar28 & 0xf) * '\x11';
LAB_00a7a1c9:
    bVar42 = (src >> 0x21 & 1) != 0;
    uVar30 = 0;
    do {
      uVar7 = uVar30 >> 2 & 0x3fffffff;
      uVar10 = (uint)uVar30 & 3;
      lVar37 = uVar7 + (ulong)uVar10 * 4;
      lVar8 = lVar37 * 3;
      if ((src >> 0x20 & 1) == 0) {
        uVar10 = (uint)uVar7;
      }
      bVar43 = 1 < uVar10;
      uVar10 = (uint)((src >> (uVar30 & 0x3f) & 1) != 0) +
               ((uint)(src >> ((char)uVar30 + 0x10U & 0x3f)) & 1) * 2;
      if (uVar10 != 2 || (bVar42 || !alphaMode)) {
        if ((bVar42 || !alphaMode) || (iVar11 = 0, (uVar10 & 0xfffffffd) != 0)) {
          iVar11 = decompressETC2Block::modifierTable[(uint)(&local_64)[bVar43]][uVar10];
        }
        iVar15 = (uint)local_68[bVar43] + iVar11;
        if (0xfe < iVar15) {
          iVar15 = 0xff;
        }
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        dst[lVar8] = (deUint8)iVar15;
        iVar15 = (uint)local_6c[bVar43] + iVar11;
        if (0xfe < iVar15) {
          iVar15 = 0xff;
        }
        if (iVar15 < 1) {
          iVar15 = 0;
        }
        dst[lVar8 + 1] = (deUint8)iVar15;
        iVar11 = iVar11 + (uint)local_56[bVar43];
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        dst[lVar8 + 2] = (deUint8)iVar11;
        dVar4 = 0xff;
        if (alphaMode) goto LAB_00a7a2e2;
      }
      else {
        (dst + lVar8)[0] = '\0';
        (dst + lVar8)[1] = '\0';
        dst[lVar8 + 2] = '\0';
        dVar4 = '\0';
LAB_00a7a2e2:
        alphaDst[lVar37] = dVar4;
      }
      uVar30 = uVar30 + 1;
    } while (uVar30 != 0x10);
  }
  return;
}

Assistant:

void decompressETC2Block (deUint8 dst[ETC2_UNCOMPRESSED_BLOCK_SIZE_RGB8], deUint64 src, deUint8 alphaDst[ETC2_UNCOMPRESSED_BLOCK_SIZE_A8], bool alphaMode)
{
	enum Etc2Mode
	{
		MODE_INDIVIDUAL = 0,
		MODE_DIFFERENTIAL,
		MODE_T,
		MODE_H,
		MODE_PLANAR,

		MODE_LAST
	};

	const int		diffOpaqueBit	= (int)getBit(src, 33);
	const deInt8	selBR			= (deInt8)getBits(src, 59, 63);	// 5 bits.
	const deInt8	selBG			= (deInt8)getBits(src, 51, 55);
	const deInt8	selBB			= (deInt8)getBits(src, 43, 47);
	const deInt8	selDR			= extendSigned3To8((deUint8)getBits(src, 56, 58)); // 3 bits.
	const deInt8	selDG			= extendSigned3To8((deUint8)getBits(src, 48, 50));
	const deInt8	selDB			= extendSigned3To8((deUint8)getBits(src, 40, 42));
	Etc2Mode		mode;

	if (!alphaMode && diffOpaqueBit == 0)
		mode = MODE_INDIVIDUAL;
	else if (!de::inRange(selBR + selDR, 0, 31))
		mode = MODE_T;
	else if (!de::inRange(selBG + selDG, 0, 31))
		mode = MODE_H;
	else if (!de::inRange(selBB + selDB, 0, 31))
		mode = MODE_PLANAR;
	else
		mode = MODE_DIFFERENTIAL;

	if (mode == MODE_INDIVIDUAL || mode == MODE_DIFFERENTIAL)
	{
		// Individual and differential modes have some steps in common, handle them here.
		static const int modifierTable[8][4] =
		{
		//	  00   01   10    11
			{  2,   8,  -2,   -8 },
			{  5,  17,  -5,  -17 },
			{  9,  29,  -9,  -29 },
			{ 13,  42, -13,  -42 },
			{ 18,  60, -18,  -60 },
			{ 24,  80, -24,  -80 },
			{ 33, 106, -33, -106 },
			{ 47, 183, -47, -183 }
		};

		const int		flipBit		= (int)getBit(src, 32);
		const deUint32	table[2]	= { getBits(src, 37, 39), getBits(src, 34, 36) };
		deUint8			baseR[2];
		deUint8			baseG[2];
		deUint8			baseB[2];

		if (mode == MODE_INDIVIDUAL)
		{
			// Individual mode, initial values.
			baseR[0] = extend4To8((deUint8)getBits(src, 60, 63));
			baseR[1] = extend4To8((deUint8)getBits(src, 56, 59));
			baseG[0] = extend4To8((deUint8)getBits(src, 52, 55));
			baseG[1] = extend4To8((deUint8)getBits(src, 48, 51));
			baseB[0] = extend4To8((deUint8)getBits(src, 44, 47));
			baseB[1] = extend4To8((deUint8)getBits(src, 40, 43));
		}
		else
		{
			// Differential mode, initial values.
			baseR[0] = extend5To8(selBR);
			baseG[0] = extend5To8(selBG);
			baseB[0] = extend5To8(selBB);

			baseR[1] = extend5To8((deUint8)(selBR + selDR));
			baseG[1] = extend5To8((deUint8)(selBG + selDG));
			baseB[1] = extend5To8((deUint8)(selBB + selDB));
		}

		// Write final pixels for individual or differential mode.
		for (int pixelNdx = 0; pixelNdx < ETC2_BLOCK_HEIGHT*ETC2_BLOCK_WIDTH; pixelNdx++)
		{
			const int		x				= pixelNdx / ETC2_BLOCK_HEIGHT;
			const int		y				= pixelNdx % ETC2_BLOCK_HEIGHT;
			const int		dstOffset		= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8;
			const int		subBlock		= ((flipBit ? y : x) >= 2) ? 1 : 0;
			const deUint32	tableNdx		= table[subBlock];
			const deUint32	modifierNdx		= (getBit(src, 16+pixelNdx) << 1) | getBit(src, pixelNdx);
			const int		alphaDstOffset	= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8; // Only needed for PUNCHTHROUGH version.

			// If doing PUNCHTHROUGH version (alphaMode), opaque bit may affect colors.
			if (alphaMode && diffOpaqueBit == 0 && modifierNdx == 2)
			{
				dst[dstOffset+0]			= 0;
				dst[dstOffset+1]			= 0;
				dst[dstOffset+2]			= 0;
				alphaDst[alphaDstOffset]	= 0;
			}
			else
			{
				int modifier;

				// PUNCHTHROUGH version and opaque bit may also affect modifiers.
				if (alphaMode && diffOpaqueBit == 0 && (modifierNdx == 0 || modifierNdx == 2))
					modifier = 0;
				else
					modifier = modifierTable[tableNdx][modifierNdx];

				dst[dstOffset+0] = (deUint8)deClamp32((int)baseR[subBlock] + modifier, 0, 255);
				dst[dstOffset+1] = (deUint8)deClamp32((int)baseG[subBlock] + modifier, 0, 255);
				dst[dstOffset+2] = (deUint8)deClamp32((int)baseB[subBlock] + modifier, 0, 255);

				if (alphaMode)
					alphaDst[alphaDstOffset] = 255;
			}
		}
	}
	else if (mode == MODE_T || mode == MODE_H)
	{
		// T and H modes have some steps in common, handle them here.
		static const int distTable[8] = { 3, 6, 11, 16, 23, 32, 41, 64 };

		deUint8 paintR[4];
		deUint8 paintG[4];
		deUint8 paintB[4];

		if (mode == MODE_T)
		{
			// T mode, calculate paint values.
			const deUint8	R1a			= (deUint8)getBits(src, 59, 60);
			const deUint8	R1b			= (deUint8)getBits(src, 56, 57);
			const deUint8	G1			= (deUint8)getBits(src, 52, 55);
			const deUint8	B1			= (deUint8)getBits(src, 48, 51);
			const deUint8	R2			= (deUint8)getBits(src, 44, 47);
			const deUint8	G2			= (deUint8)getBits(src, 40, 43);
			const deUint8	B2			= (deUint8)getBits(src, 36, 39);
			const deUint32	distNdx		= (getBits(src, 34, 35) << 1) | getBit(src, 32);
			const int		dist		= distTable[distNdx];

			paintR[0] = extend4To8((deUint8)((R1a << 2) | R1b));
			paintG[0] = extend4To8(G1);
			paintB[0] = extend4To8(B1);
			paintR[2] = extend4To8(R2);
			paintG[2] = extend4To8(G2);
			paintB[2] = extend4To8(B2);
			paintR[1] = (deUint8)deClamp32((int)paintR[2] + dist, 0, 255);
			paintG[1] = (deUint8)deClamp32((int)paintG[2] + dist, 0, 255);
			paintB[1] = (deUint8)deClamp32((int)paintB[2] + dist, 0, 255);
			paintR[3] = (deUint8)deClamp32((int)paintR[2] - dist, 0, 255);
			paintG[3] = (deUint8)deClamp32((int)paintG[2] - dist, 0, 255);
			paintB[3] = (deUint8)deClamp32((int)paintB[2] - dist, 0, 255);
		}
		else
		{
			// H mode, calculate paint values.
			const deUint8	R1		= (deUint8)getBits(src, 59, 62);
			const deUint8	G1a		= (deUint8)getBits(src, 56, 58);
			const deUint8	G1b		= (deUint8)getBit(src, 52);
			const deUint8	B1a		= (deUint8)getBit(src, 51);
			const deUint8	B1b		= (deUint8)getBits(src, 47, 49);
			const deUint8	R2		= (deUint8)getBits(src, 43, 46);
			const deUint8	G2		= (deUint8)getBits(src, 39, 42);
			const deUint8	B2		= (deUint8)getBits(src, 35, 38);
			deUint8			baseR[2];
			deUint8			baseG[2];
			deUint8			baseB[2];
			deUint32		baseValue[2];
			deUint32		distNdx;
			int				dist;

			baseR[0]		= extend4To8(R1);
			baseG[0]		= extend4To8((deUint8)((G1a << 1) | G1b));
			baseB[0]		= extend4To8((deUint8)((B1a << 3) | B1b));
			baseR[1]		= extend4To8(R2);
			baseG[1]		= extend4To8(G2);
			baseB[1]		= extend4To8(B2);
			baseValue[0]	= (((deUint32)baseR[0]) << 16) | (((deUint32)baseG[0]) << 8) | baseB[0];
			baseValue[1]	= (((deUint32)baseR[1]) << 16) | (((deUint32)baseG[1]) << 8) | baseB[1];
			distNdx			= (getBit(src, 34) << 2) | (getBit(src, 32) << 1) | (deUint32)(baseValue[0] >= baseValue[1]);
			dist			= distTable[distNdx];

			paintR[0]		= (deUint8)deClamp32((int)baseR[0] + dist, 0, 255);
			paintG[0]		= (deUint8)deClamp32((int)baseG[0] + dist, 0, 255);
			paintB[0]		= (deUint8)deClamp32((int)baseB[0] + dist, 0, 255);
			paintR[1]		= (deUint8)deClamp32((int)baseR[0] - dist, 0, 255);
			paintG[1]		= (deUint8)deClamp32((int)baseG[0] - dist, 0, 255);
			paintB[1]		= (deUint8)deClamp32((int)baseB[0] - dist, 0, 255);
			paintR[2]		= (deUint8)deClamp32((int)baseR[1] + dist, 0, 255);
			paintG[2]		= (deUint8)deClamp32((int)baseG[1] + dist, 0, 255);
			paintB[2]		= (deUint8)deClamp32((int)baseB[1] + dist, 0, 255);
			paintR[3]		= (deUint8)deClamp32((int)baseR[1] - dist, 0, 255);
			paintG[3]		= (deUint8)deClamp32((int)baseG[1] - dist, 0, 255);
			paintB[3]		= (deUint8)deClamp32((int)baseB[1] - dist, 0, 255);
		}

		// Write final pixels for T or H mode.
		for (int pixelNdx = 0; pixelNdx < ETC2_BLOCK_HEIGHT*ETC2_BLOCK_WIDTH; pixelNdx++)
		{
			const int		x				= pixelNdx / ETC2_BLOCK_HEIGHT;
			const int		y				= pixelNdx % ETC2_BLOCK_HEIGHT;
			const int		dstOffset		= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8;
			const deUint32	paintNdx		= (getBit(src, 16+pixelNdx) << 1) | getBit(src, pixelNdx);
			const int		alphaDstOffset	= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8; // Only needed for PUNCHTHROUGH version.

			if (alphaMode && diffOpaqueBit == 0 && paintNdx == 2)
			{
				dst[dstOffset+0]			= 0;
				dst[dstOffset+1]			= 0;
				dst[dstOffset+2]			= 0;
				alphaDst[alphaDstOffset]	= 0;
			}
			else
			{
				dst[dstOffset+0] = (deUint8)deClamp32((int)paintR[paintNdx], 0, 255);
				dst[dstOffset+1] = (deUint8)deClamp32((int)paintG[paintNdx], 0, 255);
				dst[dstOffset+2] = (deUint8)deClamp32((int)paintB[paintNdx], 0, 255);

				if (alphaMode)
					alphaDst[alphaDstOffset] = 255;
			}
		}
	}
	else
	{
		// Planar mode.
		const deUint8 GO1	= (deUint8)getBit(src, 56);
		const deUint8 GO2	= (deUint8)getBits(src, 49, 54);
		const deUint8 BO1	= (deUint8)getBit(src, 48);
		const deUint8 BO2	= (deUint8)getBits(src, 43, 44);
		const deUint8 BO3	= (deUint8)getBits(src, 39, 41);
		const deUint8 RH1	= (deUint8)getBits(src, 34, 38);
		const deUint8 RH2	= (deUint8)getBit(src, 32);
		const deUint8 RO	= extend6To8((deUint8)getBits(src, 57, 62));
		const deUint8 GO	= extend7To8((deUint8)((GO1 << 6) | GO2));
		const deUint8 BO	= extend6To8((deUint8)((BO1 << 5) | (BO2 << 3) | BO3));
		const deUint8 RH	= extend6To8((deUint8)((RH1 << 1) | RH2));
		const deUint8 GH	= extend7To8((deUint8)getBits(src, 25, 31));
		const deUint8 BH	= extend6To8((deUint8)getBits(src, 19, 24));
		const deUint8 RV	= extend6To8((deUint8)getBits(src, 13, 18));
		const deUint8 GV	= extend7To8((deUint8)getBits(src, 6, 12));
		const deUint8 BV	= extend6To8((deUint8)getBits(src, 0, 5));

		// Write final pixels for planar mode.
		for (int y = 0; y < 4; y++)
		{
			for (int x = 0; x < 4; x++)
			{
				const int dstOffset			= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_RGB8;
				const int unclampedR		= (x * ((int)RH-(int)RO) + y * ((int)RV-(int)RO) + 4*(int)RO + 2) >> 2;
				const int unclampedG		= (x * ((int)GH-(int)GO) + y * ((int)GV-(int)GO) + 4*(int)GO + 2) >> 2;
				const int unclampedB		= (x * ((int)BH-(int)BO) + y * ((int)BV-(int)BO) + 4*(int)BO + 2) >> 2;
				const int alphaDstOffset	= (y*ETC2_BLOCK_WIDTH + x)*ETC2_UNCOMPRESSED_PIXEL_SIZE_A8; // Only needed for PUNCHTHROUGH version.

				dst[dstOffset+0] = (deUint8)deClamp32(unclampedR, 0, 255);
				dst[dstOffset+1] = (deUint8)deClamp32(unclampedG, 0, 255);
				dst[dstOffset+2] = (deUint8)deClamp32(unclampedB, 0, 255);

				if (alphaMode)
					alphaDst[alphaDstOffset] = 255;
			}
		}
	}
}